

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void __thiscall
flatbuffers::JsonPrinter::GenField<float>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  Optional<float> OVar1;
  undefined3 in_register_00000009;
  float defaultval;
  _Storage<float,_true> val;
  
  if (CONCAT31(in_register_00000009,fixed) == 0) {
    if (fd->presence == kOptional) {
      OVar1 = Table::GetOptional<float,float>(table,(fd->value).offset);
      if (((ulong)OVar1.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float> >> 0x20 & 1) == 0) {
        std::__cxx11::string::append((char *)this->text);
        return;
      }
      val = OVar1.super__Optional_base<float,_true,_true>._M_payload.
            super__Optional_payload_base<float>._M_payload;
    }
    else {
      field = (fd->value).offset;
      defaultval = GetFieldDefault<float>(fd);
      val._M_value = Table::GetField<float>(table,field,defaultval);
    }
  }
  else {
    val = (_Storage<float,_true>)((_Storage<float,_true> *)(table + (fd->value).offset))->_M_value;
  }
  PrintScalar<float>(this,val._M_value,&(fd->value).type,indent);
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }